

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

void place_trap(chunk *c,loc grid,wchar_t t_idx,wchar_t trap_level)

{
  bitflag *flags;
  short sVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined4 uVar6;
  level_conflict *plVar4;
  trap_kind_conflict *ptVar7;
  trap_kind_conflict *ptVar8;
  _Bool _Var9;
  int iVar10;
  wchar_t wVar11;
  trap *trap;
  trap *ptVar12;
  square *psVar13;
  void *p;
  wchar_t feat;
  ulong uVar14;
  uint32_t uVar15;
  long lVar16;
  random_value v;
  
  if ((t_idx < L'\x01') || ((uint)z_info->trap_max <= (uint)t_idx)) {
    _Var9 = square_player_trap_allowed(c,grid);
    if (!_Var9) {
      return;
    }
    psVar13 = square((chunk_conflict *)c,grid);
    feat = (wchar_t)psVar13->feat;
    _Var9 = feat_is_trap_holding(feat);
    if (!_Var9) {
      return;
    }
    if (c->depth == L'\0') {
      return;
    }
    p = mem_zalloc((ulong)z_info->trap_max << 2);
    lVar16 = 0x68;
    uVar15 = 0;
    for (uVar14 = 0; ptVar7 = trap_info, uVar14 < z_info->trap_max; uVar14 = uVar14 + 1) {
      *(uint32_t *)((long)p + uVar14 * 4) = uVar15;
      if ((*(long *)((long)ptVar7 + lVar16 + -0x68) != 0) &&
         (*(int *)((long)ptVar7 + lVar16 + -0x1c) != 0)) {
        flags = ptVar7->flags + lVar16 + -0x68;
        _Var9 = flag_has_dbg(flags,3,2,"kind->flags","TRF_TRAP");
        if ((((_Var9) && (*(wchar_t *)(ptVar7->flags + lVar16 + -0x80) <= trap_level)) &&
            (((_Var9 = feat_is_tree(feat), !_Var9 ||
              (_Var9 = flag_has_dbg(flags,3,6,"kind->flags","TRF_TREE"), _Var9)) &&
             ((_Var9 = feat_is_floor(feat), !_Var9 ||
              (_Var9 = flag_has_dbg(flags,3,5,"kind->flags","TRF_FLOOR"), _Var9)))))) &&
           ((wVar11 = level_topography((int)player->place), wVar11 == L'\a' ||
            (_Var9 = flag_has_dbg(flags,3,4,"kind->flags","TRF_DUNGEON"), !_Var9)))) {
          _Var9 = flag_has_dbg(flags,3,7,"kind->flags","TRF_DOWN");
          if (_Var9) {
            sVar1 = player->place;
            plVar4 = world->levels;
            _Var9 = quest_forbid_downstairs((int)sVar1);
            if ((_Var9) ||
               (((plVar4[(int)sVar1].down == (char *)0x0 &&
                 (_Var9 = underworld_possible(plVar4[(int)sVar1].index), !_Var9)) ||
                ((player->opts).opt[0x2a] != false)))) goto LAB_001c4a6a;
          }
          uVar15 = (int)(100 / (long)*(int *)((long)ptVar7 + lVar16 + -0x1c)) +
                   *(int *)((long)p + uVar14 * 4);
          *(uint32_t *)((long)p + uVar14 * 4) = uVar15;
        }
      }
LAB_001c4a6a:
      lVar16 = lVar16 + 0x88;
    }
    if (uVar15 == 0) {
      mem_free(p);
      return;
    }
    uVar15 = Rand_div(uVar15);
    t_idx = (wchar_t)z_info->trap_max;
    for (uVar14 = 0; z_info->trap_max != uVar14; uVar14 = uVar14 + 1) {
      if ((int)uVar15 < *(int *)((long)p + uVar14 * 4)) {
        t_idx = (wchar_t)uVar14;
        break;
      }
    }
    mem_free(p);
    if ((uint)z_info->trap_max <= (uint)t_idx) {
      return;
    }
  }
  if (((player != (player *)0x0) && (player->upkeep != (player_upkeep *)0x0)) &&
     ((player->upkeep->arena_level == true &&
      (_Var9 = flag_has_dbg(trap_info[(uint)t_idx].flags,3,7,"trap_info[t_idx].flags","TRF_DOWN"),
      _Var9)))) {
    return;
  }
  trap = (trap *)mem_zalloc(0x28);
  ptVar12 = square_trap((chunk_conflict *)c,grid);
  trap->next = ptVar12;
  square_set_trap((chunk_conflict *)c,grid,trap);
  trap->t_idx = (uint8_t)t_idx;
  ptVar8 = trap_info;
  trap->kind = (trap_kind *)(trap_info + (uint)t_idx);
  trap->grid = grid;
  ptVar7 = ptVar8 + (uint)t_idx;
  uVar2 = (ptVar7->power).base;
  uVar5 = (ptVar7->power).dice;
  v.dice = uVar5;
  v.base = uVar2;
  ptVar8 = ptVar8 + (uint)t_idx;
  uVar3 = (ptVar8->power).sides;
  uVar6 = (ptVar8->power).m_bonus;
  v.m_bonus = uVar6;
  v.sides = uVar3;
  iVar10 = randcalc(v,trap_level,RANDOMISE);
  trap->power = (uint8_t)iVar10;
  flag_copy(trap->flags,trap_info[(uint)t_idx].flags,3);
  _Var9 = flag_has_dbg(trap->flags,3,0x10,"new_trap->flags","TRF_M_TRAP");
  if (_Var9) {
    player->num_traps = player->num_traps + '\x01';
  }
  psVar13 = square((chunk_conflict *)c,grid);
  flag_on_dbg(psVar13->info,3,9,"square(c, grid)->info","SQUARE_TRAP");
  square_note_spot(c,grid);
  square_light_spot(c,grid);
  return;
}

Assistant:

void place_trap(struct chunk *c, struct loc grid, int t_idx, int trap_level)
{
	struct trap *new_trap;

	/* We've been called with an illegal index; choose a random trap */
	if ((t_idx <= 0) || (t_idx >= z_info->trap_max)) {
		/* Require the correct terrain */
		if (!square_player_trap_allowed(c, grid)) return;

		t_idx = pick_trap(c, square(c, grid)->feat, trap_level);
	}

	/* Failure */
	if (t_idx < 0) return;
	/* Don't allow trap doors in single combat arenas. */
	if (player && player->upkeep && player->upkeep->arena_level
			&& trf_has(trap_info[t_idx].flags, TRF_DOWN)) {
		return;
	}

	/* Allocate a new trap for this grid (at the front of the list) */
	new_trap = mem_zalloc(sizeof(*new_trap));
	new_trap->next = square_trap(c, grid);
	square_set_trap(c, grid, new_trap);

	/* Set the details */
	new_trap->t_idx = t_idx;
	new_trap->kind = &trap_info[t_idx];
	new_trap->grid = grid;
	new_trap->power = randcalc(new_trap->kind->power, trap_level, RANDOMISE);
	trf_copy(new_trap->flags, trap_info[t_idx].flags);

	/* We created a monster trap */
	if (trf_has(new_trap->flags, TRF_M_TRAP)) {
		player->num_traps++;
	}

	/* Toggle on the trap marker */
	sqinfo_on(square(c, grid)->info, SQUARE_TRAP);

	/* Redraw the grid */
	square_note_spot(c, grid);
	square_light_spot(c, grid);
}